

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_basename_word_prefix
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  bool bVar1;
  __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  *this_00;
  pointer pCVar2;
  reference pcVar3;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *in_RSI;
  long in_RDI;
  const_iterator query_last_it;
  Iterator query_it;
  __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  props_it;
  const_iterator item_last;
  const_iterator item_first;
  Iterator item_it;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  __normal_iterator<const___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  char *local_40;
  CharProperties *local_38;
  __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  local_30;
  char *local_28;
  char *local_20;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_18;
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *local_10;
  
  local_18._M_current = *(char **)(in_RDI + 0x20);
  local_10 = in_RSI;
  local_20 = (char *)std::vector<char,_std::allocator<char>_>::cbegin
                               ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  local_28 = (char *)std::vector<char,_std::allocator<char>_>::cend
                               ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  local_38 = (CharProperties *)
             std::
             vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ::cbegin((vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
                       *)in_stack_ffffffffffffff88);
  this_00 = (__normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
             *)(in_RDI + 0x20);
  local_40 = (char *)std::vector<char,_std::allocator<char>_>::cbegin
                               ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  __gnu_cxx::operator-
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_ffffffffffffff88);
  local_30 = __gnu_cxx::
             __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
             ::operator+(this_00,CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_48._M_current = *(char **)(in_RDI + 0x40);
  local_50._M_current =
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
       std::
       vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
       ::cbegin(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
             ::operator->(&local_30);
    if ((pCVar2->word_start & 1U) != 0) {
      __gnu_cxx::
      __normal_iterator<const___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<const___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::operator*(&local_50);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_stack_ffffffffffffff88);
    if (bVar1) {
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_18);
      in_stack_ffffffffffffff94 = (int)*pcVar3;
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_48);
      if (in_stack_ffffffffffffff94 == *pcVar3) {
        __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
        operator++(&local_48);
        in_stack_ffffffffffffff88 = local_10;
        __gnu_cxx::operator-
                  ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   local_10);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (value_type *)in_stack_ffffffffffffff88);
      }
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_18);
    __gnu_cxx::
    __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void get_match_positions_basename_word_prefix(
      std::vector<std::size_t>& posns) const {
    auto item_it = item_basename_;
    auto const item_first = item_.cbegin();
    auto const item_last = item_.cend();
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto query_last_it = qit_basename_words_.cbegin();

    while (item_it != item_last) {
      if (props_it->word_start) {
        ++query_last_it;
      }
      if (query_it != *query_last_it && *item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
      ++props_it;
    }
  }